

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O3

void Sfm_LibPrepareAdd(Sfm_Lib_t *p,word *pTruth,int *Perm,int nFanins,Mio_Cell2_t *pCellBot,
                      Mio_Cell2_t *pCellTop,int InTop)

{
  uint uVar1;
  int *piVar2;
  word wVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Sfm_Fun_t *pSVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  Sfm_Fun_t *pSVar12;
  int iVar13;
  char cVar14;
  long lVar15;
  int Profile [8];
  int InvPerm [8];
  int local_90;
  int aiStack_78 [8];
  char acStack_58 [40];
  
  if (pCellTop == (Mio_Cell2_t *)0x0) {
    local_90 = 0;
  }
  else {
    local_90 = (int)pCellTop->AreaW;
  }
  wVar3 = pCellBot->AreaW;
  uVar4 = Vec_MemHashInsert(p->vTtMem,pTruth);
  if (uVar4 == (p->vLists).nSize) {
    Vec_IntPush(&p->vLists,-1);
    Vec_IntPush(&p->vCounts,0);
    Vec_IntPush(&p->vHits,0);
  }
  local_90 = local_90 + (int)wVar3;
  uVar8 = (ulong)(uint)nFanins;
  if (p->fDelay == 0) {
    if (((int)uVar4 < 0) || ((p->vLists).nSize <= (int)uVar4)) goto LAB_005065d0;
    lVar11 = (long)(p->vLists).pArray[uVar4];
    if ((lVar11 != -1) && (p->pObjs != (Sfm_Fun_t *)0x0)) {
      pSVar7 = p->pObjs + lVar11;
      do {
        if (pSVar7->Area <= local_90) {
          return;
        }
      } while (((long)pSVar7->Next != -1) &&
              (pSVar7 = p->pObjs + pSVar7->Next, p->pObjs != (Sfm_Fun_t *)0x0));
    }
  }
  else {
    if ((p->vProfs).nSize != p->nObjs) {
      __assert_fail("Vec_IntSize(&p->vProfs) == p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/sfm/sfmLib.c"
                    ,0x15f,
                    "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                   );
    }
    if (0 < nFanins) {
      uVar9 = *(uint *)&pCellBot->field_0x10;
      uVar10 = 0;
      do {
        iVar13 = 1;
        if (Perm[uVar10] < (int)(uVar9 >> 0x1c)) {
          iVar13 = 2 - (uint)(pCellTop == (Mio_Cell2_t *)0x0);
        }
        aiStack_78[uVar10] = iVar13;
        uVar10 = uVar10 + 1;
      } while (uVar8 != uVar10);
    }
    (p->vTemp).nSize = 0;
    if (((int)uVar4 < 0) || ((p->vLists).nSize <= (int)uVar4)) goto LAB_005065d0;
    lVar11 = (long)(p->vLists).pArray[uVar4];
    if ((lVar11 != -1) && (p->pObjs != (Sfm_Fun_t *)0x0)) {
      pSVar12 = p->pObjs + lVar11;
      pSVar7 = p->pObjs;
      do {
        Vec_IntPush(&p->vTemp,(int)((ulong)((long)pSVar12 - (long)pSVar7) >> 2) * -0x49249249);
        pSVar7 = p->pObjs;
        uVar9 = (int)((long)pSVar12 - (long)pSVar7 >> 2) * -0x49249249;
        if (((int)uVar9 < 0) || ((p->vProfs).nSize <= (int)uVar9)) goto LAB_005065d0;
        uVar9 = (p->vProfs).pArray[uVar9 & 0x7fffffff];
        if (((int)uVar9 < 0) || ((p->vStore).nSize <= (int)uVar9)) goto LAB_005065ef;
        if (pSVar12->Area <= local_90) {
          if (nFanins < 1) {
LAB_005061ef:
            p->nObjSkipped = p->nObjSkipped + 1;
            return;
          }
          uVar10 = 0;
          while ((p->vStore).pArray[uVar9 + uVar10] <= aiStack_78[uVar10]) {
            uVar10 = uVar10 + 1;
            if (uVar8 == uVar10) goto LAB_005061ef;
          }
        }
      } while (((long)pSVar12->Next != -1) &&
              (pSVar12 = pSVar7 + pSVar12->Next, pSVar7 != (Sfm_Fun_t *)0x0));
      iVar13 = (p->vTemp).nSize;
      if (0 < iVar13) {
        piVar2 = (p->vTemp).pArray;
        lVar11 = 0;
        uVar9 = 0;
        do {
          iVar6 = piVar2[lVar11];
          lVar15 = (long)iVar6;
          if ((lVar15 < 0) || ((p->vProfs).nSize <= iVar6)) goto LAB_005065d0;
          uVar1 = (p->vProfs).pArray[lVar15];
          if (((int)uVar1 < 0) || ((p->vStore).nSize <= (int)uVar1)) {
LAB_005065ef:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          if (p->pObjs[lVar15].Area < local_90) {
LAB_005064a7:
            if (((int)uVar9 < 0) || (iVar13 <= (int)uVar9)) goto LAB_005066a9;
            uVar10 = (ulong)uVar9;
            uVar9 = uVar9 + 1;
            piVar2[uVar10] = iVar6;
            iVar13 = (p->vTemp).nSize;
          }
          else {
            if (0 < nFanins) {
              uVar10 = 0;
              do {
                if ((p->vStore).pArray[uVar1 + uVar10] < aiStack_78[uVar10]) goto LAB_005064a7;
                uVar10 = uVar10 + 1;
              } while (uVar8 != uVar10);
            }
            p->nObjRemoved = p->nObjRemoved + 1;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < iVar13);
        if ((int)uVar9 < (int)lVar11) {
          if (uVar9 == 0) {
            if ((p->vLists).nSize <= (int)uVar4) {
LAB_005066a9:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            pSVar7 = (Sfm_Fun_t *)((p->vLists).pArray + uVar4);
          }
          else {
            if (iVar13 < (int)uVar9) {
              __assert_fail("p->nSize >= nSizeNew",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                            ,0x2b5,"void Vec_IntShrink(Vec_Int_t *, int)");
            }
            (p->vTemp).nSize = uVar9;
            if ((int)uVar9 < 1) goto LAB_005065d0;
            if ((p->vLists).nSize <= (int)uVar4) goto LAB_005066a9;
            piVar2 = (p->vTemp).pArray;
            iVar13 = *piVar2;
            (p->vLists).pArray[uVar4] = iVar13;
            lVar11 = (long)(p->vTemp).nSize;
            pSVar7 = p->pObjs;
            if (1 < lVar11) {
              lVar15 = 1;
              iVar6 = iVar13;
              do {
                iVar13 = piVar2[lVar15];
                pSVar7[iVar6].Next = iVar13;
                lVar15 = lVar15 + 1;
                iVar6 = iVar13;
              } while (lVar11 != lVar15);
            }
            pSVar7 = pSVar7 + iVar13;
          }
          pSVar7->Next = -1;
        }
      }
    }
  }
  if (0 < nFanins) {
    uVar10 = 0;
    do {
      *(int *)(acStack_58 + (long)Perm[uVar10] * 4) = (int)uVar10;
      uVar10 = uVar10 + 1;
    } while (uVar8 != uVar10);
  }
  if ((p->fDelay != 0) && (Vec_IntPush(&p->vProfs,(p->vStore).nSize), 0 < nFanins)) {
    uVar10 = 0;
    do {
      Vec_IntPush(&p->vStore,aiStack_78[uVar10]);
      uVar10 = uVar10 + 1;
    } while (uVar8 != uVar10);
  }
  iVar13 = p->nObjs;
  if (iVar13 == p->nObjsAlloc) {
    iVar6 = iVar13 * 2;
    if (p->pObjs == (Sfm_Fun_t *)0x0) {
      pSVar7 = (Sfm_Fun_t *)malloc((long)iVar13 * 0x38);
      iVar5 = iVar13;
    }
    else {
      pSVar7 = (Sfm_Fun_t *)realloc(p->pObjs,(long)iVar13 * 0x38);
      iVar13 = p->nObjs;
      iVar5 = p->nObjsAlloc;
    }
    p->pObjs = pSVar7;
    memset(pSVar7 + iVar5,0,(long)iVar5 * 0x1c);
    p->nObjsAlloc = iVar6;
  }
  else {
    pSVar7 = p->pObjs;
  }
  pSVar7[iVar13].Area = local_90;
  if ((-1 < (int)uVar4) && ((int)uVar4 < (p->vLists).nSize)) {
    pSVar12 = pSVar7 + iVar13;
    piVar2 = (p->vLists).pArray;
    pSVar12->Next = piVar2[uVar4];
    p->nObjs = iVar13 + 1;
    piVar2[uVar4] = iVar13;
    if ((p->vCounts).nSize <= (int)uVar4) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                    ,0x1da,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
    }
    piVar2 = (p->vCounts).pArray + uVar4;
    *piVar2 = *piVar2 + 1;
    if ((*(uint *)&pCellBot->field_0x10 & 0x3ffff80) != 0) {
      __assert_fail("pCellBot->Id < 128",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/sfm/sfmLib.c"
                    ,0x1aa,
                    "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                   );
    }
    pSVar12->pFansB[0] = (char)*(uint *)&pCellBot->field_0x10;
    uVar8 = 0;
    if (0xfffffff < *(uint *)&pCellBot->field_0x10) {
      uVar8 = 0;
      do {
        pSVar7[iVar13].pFansB[uVar8 + 1] = acStack_58[uVar8 * 4];
        uVar8 = uVar8 + 1;
      } while (uVar8 < *(uint *)&pCellBot->field_0x10 >> 0x1c);
    }
    iVar6 = (int)uVar8;
    if (pCellTop != (Mio_Cell2_t *)0x0) {
      if ((*(uint *)&pCellTop->field_0x10 & 0x3ffff80) != 0) {
        __assert_fail("pCellTop->Id < 128",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/sfm/sfmLib.c"
                      ,0x1b0,
                      "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                     );
      }
      pSVar12->pFansT[0] = (char)*(uint *)&pCellTop->field_0x10;
      if (0xfffffff < *(uint *)&pCellTop->field_0x10) {
        uVar10 = 0;
        do {
          cVar14 = '\x10';
          if ((uint)InTop != uVar10) {
            iVar6 = (int)uVar8;
            uVar8 = (ulong)(iVar6 + 1);
            cVar14 = acStack_58[(long)iVar6 * 4];
          }
          iVar6 = (int)uVar8;
          pSVar7[iVar13].pFansT[uVar10 + 1] = cVar14;
          uVar10 = uVar10 + 1;
        } while (uVar10 < *(uint *)&pCellTop->field_0x10 >> 0x1c);
      }
      if (iVar6 != nFanins) {
        __assert_fail("k == nFanins",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/sfm/sfmLib.c"
                      ,0x1b4,
                      "void Sfm_LibPrepareAdd(Sfm_Lib_t *, word *, int *, int, Mio_Cell2_t *, Mio_Cell2_t *, int)"
                     );
      }
    }
    return;
  }
LAB_005065d0:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Sfm_LibPrepareAdd( Sfm_Lib_t * p, word * pTruth, int * Perm, int nFanins, Mio_Cell2_t * pCellBot, Mio_Cell2_t * pCellTop, int InTop )
{
    Sfm_Fun_t * pObj;
    int InvPerm[SFM_SUPP_MAX], Profile[SFM_SUPP_MAX];
    int Area = (int)pCellBot->AreaW + (pCellTop ? (int)pCellTop->AreaW : 0);
    int i, k, Id, Prev, Offset, * pProf, iFunc = Vec_MemHashInsert( p->vTtMem, pTruth );
    if ( iFunc == Vec_IntSize(&p->vLists) )
    {
        Vec_IntPush( &p->vLists, -1 );
        Vec_IntPush( &p->vCounts, 0 );
        Vec_IntPush( &p->vHits,   0 );
    }
    assert( pCellBot != NULL );
    // iterate through the supergates of this truth table
    if ( p->fDelay )
    {
        assert( Vec_IntSize(&p->vProfs) == p->nObjs );
        Sfm_LibCellProfile( pCellBot, pCellTop, InTop, nFanins, Perm, Profile );
        // check if new one is contained in old ones
        Vec_IntClear( &p->vTemp );
        Sfm_LibForEachSuper( p, pObj, iFunc )
        {
            Vec_IntPush( &p->vTemp, Sfm_LibFunId(p, pObj) );
            Offset = Vec_IntEntry( &p->vProfs, Sfm_LibFunId(p, pObj) );
            pProf  = Vec_IntEntryP( &p->vStore, Offset );
            if ( Sfm_LibNewIsContained(pObj, pProf, Area, Profile, nFanins) )
            {
                p->nObjSkipped++;
                return;
            }
        }
        // check if old ones are contained in new one
        k = 0;
        Vec_IntForEachEntry( &p->vTemp, Id, i )
        {
            Offset = Vec_IntEntry( &p->vProfs, Id );
            pProf  = Vec_IntEntryP( &p->vStore, Offset );
            if ( !Sfm_LibNewContains(Sfm_LibFun(p, Id), pProf, Area, Profile, nFanins) )
                Vec_IntWriteEntry( &p->vTemp, k++, Id );
            else
                p->nObjRemoved++;
        }
        if ( k < i ) // change
        {
            if ( k == 0 )
                Vec_IntWriteEntry( &p->vLists, iFunc, -1 );
            else
            {
                Vec_IntShrink( &p->vTemp, k );
                Prev = Vec_IntEntry(&p->vTemp, 0);
                Vec_IntWriteEntry( &p->vLists, iFunc, Prev );
                Vec_IntForEachEntryStart( &p->vTemp, Id, i, 1 )
                {
                    Sfm_LibFun(p, Prev)->Next = Id;
                    Prev = Id;
                }
                Sfm_LibFun(p, Prev)->Next = -1;
            }
        }
    }
    else
    {
        Sfm_LibForEachSuper( p, pObj, iFunc )
        {
            if ( Area >= pObj->Area )
                return;
        }
    }
    for ( k = 0; k < nFanins; k++ )
        InvPerm[Perm[k]] = k;
    // create delay profile
    if ( p->fDelay )
    {
        Vec_IntPush( &p->vProfs, Vec_IntSize(&p->vStore) );
        for ( k = 0; k < nFanins; k++ )
            Vec_IntPush( &p->vStore, Profile[k] );
    }
    // create new object
    if ( p->nObjs == p->nObjsAlloc )
    {
        int nObjsAlloc = 2 * p->nObjsAlloc;
        p->pObjs = ABC_REALLOC( Sfm_Fun_t, p->pObjs, nObjsAlloc );
        memset( p->pObjs + p->nObjsAlloc, 0, sizeof(Sfm_Fun_t) * p->nObjsAlloc );
        p->nObjsAlloc = nObjsAlloc;
    }
    pObj = p->pObjs + p->nObjs;
    pObj->Area = Area;
    pObj->Next = Vec_IntEntry(&p->vLists, iFunc);
    Vec_IntWriteEntry( &p->vLists, iFunc, p->nObjs++ );
    Vec_IntAddToEntry( &p->vCounts, iFunc, 1 );
    // create gate
    assert( pCellBot->Id < 128 );
    pObj->pFansB[0] = (char)pCellBot->Id;
    for ( k = 0; k < (int)pCellBot->nFanins; k++ )
        pObj->pFansB[k+1] = InvPerm[k];
    if ( pCellTop == NULL )
        return;
    assert( pCellTop->Id < 128 );
    pObj->pFansT[0] = (char)pCellTop->Id;
    for ( i = 0; i < (int)pCellTop->nFanins; i++ )
        pObj->pFansT[i+1] = (char)(i == InTop ? 16 : InvPerm[k++]);
    assert( k == nFanins );
}